

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

void asmjit::CodeHolder_resetInternal(CodeHolder *self,bool releaseMemory)

{
  size_t *psVar1;
  size_t sVar2;
  ulong uVar3;
  Error EVar4;
  int iVar5;
  undefined8 in_RAX;
  void *pvVar6;
  undefined4 extraout_var;
  CodeHolder *unaff_RBX;
  ulong unaff_RBP;
  undefined7 in_register_00000031;
  CodeEmitter *emitter;
  undefined8 uVar7;
  undefined8 unaff_R12;
  ulong unaff_R13;
  anon_union_4_2_424c626f_for_ArchInfo_0 *unaff_R14;
  ZoneVector<asmjit::SectionEntry_*> *unaff_R15;
  
  uVar7 = CONCAT71(in_register_00000031,releaseMemory);
  do {
    *(ulong *)((long)register0x00000020 + -8) = unaff_RBP;
    *(ZoneVector<asmjit::SectionEntry_*> **)((long)register0x00000020 + -0x10) = unaff_R15;
    *(anon_union_4_2_424c626f_for_ArchInfo_0 **)((long)register0x00000020 + -0x18) = unaff_R14;
    *(ulong *)((long)register0x00000020 + -0x20) = unaff_R13;
    *(undefined8 *)((long)register0x00000020 + -0x28) = unaff_R12;
    *(CodeHolder **)((long)register0x00000020 + -0x30) = unaff_RBX;
    *(undefined8 *)((long)register0x00000020 + -0x38) = in_RAX;
    *(int *)((long)register0x00000020 + -0x34) = (int)uVar7;
    emitter = self->_emitters;
    unaff_RBX = self;
    while (emitter != (CodeEmitter *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x40) = 0x114657;
      unaff_RBX = self;
      CodeHolder::detach(self,emitter);
      emitter = self->_emitters;
    }
    (self->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
    (self->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
    (self->_codeInfo)._baseAddress = 0xffffffffffffffff;
    self->_globalHints = 0;
    self->_globalOptions = 0;
    unaff_R15 = &self->_sections;
    self->_logger = (Logger *)0x0;
    self->_errorHandler = (ErrorHandler *)0x0;
    self->_unresolvedLabelsCount = 0;
    self->_trampolinesSize = 0;
    sVar2 = (self->_sections).super_ZoneVectorBase._length;
    if (sVar2 == 0) {
LAB_001146ca:
      *(undefined8 *)((long)register0x00000020 + -0x40) = 0x1146e0;
      ZoneHashBase::reset(&(self->_namedLabels).super_ZoneHashBase,&self->_baseHeap);
      (self->_relocations).super_ZoneVectorBase._data = (void *)0x0;
      (self->_relocations).super_ZoneVectorBase._length = 0;
      (self->_labels).super_ZoneVectorBase._length = 0;
      (self->_labels).super_ZoneVectorBase._capacity = 0;
      (self->_sections).super_ZoneVectorBase._capacity = 0;
      (self->_labels).super_ZoneVectorBase._data = (void *)0x0;
      (unaff_R15->super_ZoneVectorBase)._data = (void *)0x0;
      (self->_sections).super_ZoneVectorBase._length = 0;
      (self->_relocations).super_ZoneVectorBase._capacity = 0;
      *(undefined8 *)((long)register0x00000020 + -0x40) = 0x11470d;
      ZoneHeap::reset(&self->_baseHeap,&self->_baseZone);
      Zone::reset(&self->_baseZone,*(bool *)((long)register0x00000020 + -0x34));
      return;
    }
    unaff_R12 = 0;
    unaff_R13 = 0;
    unaff_R14 = (anon_union_4_2_424c626f_for_ArchInfo_0 *)0x0;
    while (unaff_R13 < (self->_sections).super_ZoneVectorBase._length) {
      unaff_RBP = *(ulong *)((long)(unaff_R15->super_ZoneVectorBase)._data + unaff_R13 * 8);
      unaff_RBX = *(CodeHolder **)(unaff_RBP + 0x38);
      if ((unaff_RBX != (CodeHolder *)0x0) && (*(char *)(unaff_RBP + 0x50) == '\0')) {
        *(undefined8 *)((long)register0x00000020 + -0x40) = 0x1146ba;
        free(unaff_RBX);
      }
      *(undefined8 *)(unaff_RBP + 0x38) = 0;
      *(undefined8 *)(unaff_RBP + 0x48) = 0;
      unaff_R13 = unaff_R13 + 1;
      if (sVar2 == unaff_R13) goto LAB_001146ca;
    }
    *(undefined8 *)((long)register0x00000020 + -0x40) = 0x11472d;
    CodeHolder_resetInternal();
    *(ulong *)((long)register0x00000020 + -0x40) = unaff_RBP;
    *(size_t *)((long)register0x00000020 + -0x48) = sVar2;
    *(CodeHolder **)((long)register0x00000020 + -0x50) = self;
    unaff_RBP = 7;
    if ((unaff_RBX->_codeInfo)._archInfo.field_0.field_0._type != '\0') {
      return;
    }
    if (unaff_RBX->_emitters != (CodeEmitter *)0x0) {
      *(undefined8 *)((long)register0x00000020 + -0x58) = 0x114800;
      CodeHolder::init((EVP_PKEY_CTX *)unaff_RBX);
LAB_00114784:
      *(undefined8 *)((long)register0x00000020 + -0x58) = 0x114792;
      Zone::reset(&unaff_RBX->_baseZone,false);
      return;
    }
    if ((unaff_RBX->_sections).super_ZoneVectorBase._capacity ==
        (unaff_RBX->_sections).super_ZoneVectorBase._length) {
      *(undefined8 *)((long)register0x00000020 + -0x58) = 0x11477e;
      EVar4 = ZoneVectorBase::_grow
                        (&(unaff_RBX->_sections).super_ZoneVectorBase,&unaff_RBX->_baseHeap,8,1);
      unaff_RBP = (ulong)EVar4;
      if (EVar4 != 0) goto LAB_00114784;
    }
    self = (CodeHolder *)&unaff_RBX->_baseZone;
    uVar7 = 0x58;
    *(undefined8 *)((long)register0x00000020 + -0x58) = 0x1147a2;
    pvVar6 = Zone::allocZeroed((Zone *)self,0x58);
    if (pvVar6 == (void *)0x0) goto LAB_00114784;
    *(undefined4 *)((long)pvVar6 + 4) = 3;
    *(undefined8 *)((long)pvVar6 + 0x10) = 0x747865742e;
    uVar3 = (unaff_RBX->_sections).super_ZoneVectorBase._length;
    if (uVar3 < (unaff_RBX->_sections).super_ZoneVectorBase._capacity) {
      *(void **)((long)(unaff_RBX->_sections).super_ZoneVectorBase._data + uVar3 * 8) = pvVar6;
      psVar1 = &(unaff_RBX->_sections).super_ZoneVectorBase._length;
      *psVar1 = *psVar1 + 1;
      (unaff_RBX->_codeInfo)._archInfo.field_0 = *unaff_R14;
      (unaff_RBX->_codeInfo).field_1 = *(anon_union_4_2_314a35c9_for_CodeInfo_1 *)(unaff_R14 + 1);
      (unaff_RBX->_codeInfo)._baseAddress = *(uint64_t *)(unaff_R14 + 2);
      return;
    }
    *(undefined8 *)((long)register0x00000020 + -0x58) = 0x11480f;
    iVar5 = CodeHolder::init((EVP_PKEY_CTX *)self);
    in_RAX = CONCAT44(extraout_var,iVar5);
    register0x00000020 = (BADSPACEBASE *)((long)register0x00000020 + -0x50);
  } while( true );
}

Assistant:

static void CodeHolder_resetInternal(CodeHolder* self, bool releaseMemory) noexcept {
  // Detach all `CodeEmitter`s.
  while (self->_emitters)
    self->detach(self->_emitters);

  // Reset everything into its construction state.
  self->_codeInfo.reset();
  self->_globalHints = 0;
  self->_globalOptions = 0;
  self->_logger = nullptr;
  self->_errorHandler = nullptr;

  self->_unresolvedLabelsCount = 0;
  self->_trampolinesSize = 0;

  // Reset all sections.
  size_t numSections = self->_sections.getLength();
  for (size_t i = 0; i < numSections; i++) {
    SectionEntry* section = self->_sections[i];
    if (section->_buffer.hasData() && !section->_buffer.isExternal())
      Internal::releaseMemory(section->_buffer._data);
    section->_buffer._data = nullptr;
    section->_buffer._capacity = 0;
  }

  // Reset zone allocator and all containers using it.
  ZoneHeap* heap = &self->_baseHeap;

  self->_namedLabels.reset(heap);
  self->_relocations.reset();
  self->_labels.reset();
  self->_sections.reset();

  heap->reset(&self->_baseZone);
  self->_baseZone.reset(releaseMemory);
}